

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O3

array<unsigned___int128,_4UL> *
kmer_fw_neighbours128
          (array<unsigned___int128,_4UL> *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  bool bVar1;
  char in_CL;
  long in_RDX;
  uint7 in_register_00000031;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = CONCAT71(in_register_00000031,k) * 4;
  uVar3 = -1L << (in_CL * '\x02' & 0x3fU);
  uVar5 = 0;
  uVar4 = uVar3;
  if ((in_CL * '\x02' & 0x40U) == 0) {
    uVar4 = 0xffffffffffffffff;
    uVar5 = uVar3;
  }
  uVar3 = 0;
  uVar6 = 0;
  do {
    *(ulong *)(__return_storage_ptr__->_M_elems + uVar3) = uVar3 + uVar2 & ~uVar5;
    *(ulong *)((long)__return_storage_ptr__->_M_elems + uVar3 * 0x10 + 8) =
         uVar6 + (in_RDX << 2 | (ulong)(in_register_00000031 >> 0x36)) + (ulong)CARRY8(uVar3,uVar2)
         & ~uVar4;
    bVar7 = 0xfffffffffffffffe < uVar3;
    bVar1 = uVar6 < (uVar3 < 3);
    uVar3 = uVar3 + 1;
    uVar6 = uVar6 + bVar7;
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

std::array<__uint128_t,4> kmer_fw_neighbours128(__uint128_t kmer, uint8_t k) {
    std::array<__uint128_t,4> n;
    for (__uint128_t i=0;i<4;++i){
        n[i]=((kmer<<2)+i)%(((__uint128_t) 1)<<(k*2));
    }
    return n;
}